

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jerror.c
# Opt level: O3

void emit_message(j_common_ptr cinfo,int msg_level)

{
  jpeg_error_mgr *pjVar1;
  long lVar2;
  
  pjVar1 = cinfo->err;
  if (msg_level < 0) {
    lVar2 = pjVar1->num_warnings;
    if ((lVar2 == 0) || (2 < pjVar1->trace_level)) {
      (*pjVar1->output_message)(cinfo);
      lVar2 = pjVar1->num_warnings;
    }
    pjVar1->num_warnings = lVar2 + 1;
    return;
  }
  if (pjVar1->trace_level < msg_level) {
    return;
  }
  (*pjVar1->output_message)(cinfo);
  return;
}

Assistant:

METHODDEF(void)
emit_message (j_common_ptr cinfo, int msg_level)
{
  struct jpeg_error_mgr * err = cinfo->err;

  if (msg_level < 0) {
    /* It's a warning message.  Since corrupt files may generate many warnings,
     * the policy implemented here is to show only the first warning,
     * unless trace_level >= 3.
     */
    if (err->num_warnings == 0 || err->trace_level >= 3)
      (*err->output_message) (cinfo);
    /* Always count warnings in num_warnings. */
    err->num_warnings++;
  } else {
    /* It's a trace message.  Show it if trace_level >= msg_level. */
    if (err->trace_level >= msg_level)
      (*err->output_message) (cinfo);
  }
}